

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovepEaDx<(moira::Instr)78,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Dn dst;
  Ea<(moira::Mode)5,_(moira::Size)2> src;
  StrWriter *in_stack_ffffffffffffff98;
  UInt u;
  undefined8 in_stack_ffffffffffffffa8;
  Moira *in_stack_ffffffffffffffb0;
  An local_44;
  UInt local_40;
  int local_3c;
  Dn local_34 [2];
  ushort local_2c;
  u32 local_28;
  ushort local_1a;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_10 = in_RSI;
  Op<(moira::Mode)5,(moira::Size)2>
            (in_stack_ffffffffffffffb0,(u16)((ulong)in_stack_ffffffffffffffa8 >> 0x30),in_RDI);
  Dn::Dn(local_34,(int)(uint)local_1a >> 9 & 7);
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  local_3c = in_RDI[5];
  StrWriter::operator<<(pSVar1,(Align)local_3c);
  u.raw = (u32)((ulong)in_RDI >> 0x20);
  StrWriter::operator<<(local_10,"(");
  UInt::UInt(&local_40,local_28);
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffff98,u);
  pSVar1 = StrWriter::operator<<(pSVar1,",");
  An::An(&local_44,(uint)local_2c);
  pSVar1 = StrWriter::operator<<(pSVar1,local_44);
  pSVar1 = StrWriter::operator<<(pSVar1,"), ");
  StrWriter::operator<<(pSVar1,local_34[0]);
  return;
}

Assistant:

void
Moira::dasmMovepEaDx(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <MODE_DI,S> ( _____________xxx(op), addr );
    auto dst = Dn             ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab;
    str << "(" << UInt(src.ext1) << "," << An{src.reg} << "), " << dst;
}